

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squeeze.cpp
# Opt level: O1

int __thiscall ncnn::Squeeze::forward(Squeeze *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint uVar1;
  void *pvVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  undefined4 unaff_EBP;
  undefined4 uVar10;
  long lVar11;
  byte bVar12;
  bool bVar13;
  long lVar14;
  int iVar15;
  bool bVar16;
  ulong uVar17;
  bool bVar18;
  uint uVar19;
  uint uVar20;
  bool bVar21;
  bool bVar22;
  undefined1 auVar23 [16];
  Mat local_b8;
  Option *local_68;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  ulong local_50;
  Mat *local_48;
  Mat *local_40;
  uint local_34;
  
  uVar1 = bottom_blob->dims;
  uVar17 = (ulong)uVar1;
  local_5c = bottom_blob->w;
  local_60 = bottom_blob->h;
  local_54 = bottom_blob->d;
  local_58 = bottom_blob->c;
  pvVar2 = (this->axes).data;
  if ((pvVar2 == (void *)0x0) || ((long)(this->axes).c * (this->axes).cstep == 0)) {
    auVar23._0_4_ = -(uint)(this->squeeze_w == 0);
    auVar23._4_4_ = -(uint)(this->squeeze_h == 0);
    auVar23._8_4_ = -(uint)(this->squeeze_d == 0);
    auVar23._12_4_ = -(uint)(this->squeeze_c == 0);
    uVar10 = movmskps(unaff_EBP,auVar23);
    bVar12 = (byte)uVar10 ^ 0xf;
    bVar13 = (bool)((((byte)uVar10 ^ 0xf) & 8) >> 3 & local_58 == 1);
    uVar20 = (uint)((bVar12 & 4) >> 2 & local_54 == 1);
    bVar7 = (bool)(local_5c == 1 & bVar12);
    bVar9 = (bool)((bVar12 & 2) >> 1 & local_60 == 1);
  }
  else {
    lVar11 = (long)(this->axes).w;
    if (lVar11 < 1) {
      bVar7 = false;
      bVar9 = false;
      uVar20 = 0;
      bVar13 = false;
    }
    else {
      bVar21 = local_5c == 1;
      bVar22 = local_60 == 1;
      local_50 = CONCAT44(local_50._4_4_,uVar1 - 3);
      local_34 = (uint)(local_54 == 1);
      lVar14 = 0;
      bVar9 = false;
      bVar7 = false;
      uVar19 = 0;
      bVar16 = false;
      do {
        iVar15 = *(int *)((long)pvVar2 + lVar14 * 4);
        iVar15 = (iVar15 >> 0x1f & uVar1) + iVar15;
        bVar8 = bVar9;
        bVar13 = bVar16;
        bVar6 = bVar7;
        if (iVar15 == 0) {
          bVar8 = bVar22;
          bVar13 = local_58 == 1;
          bVar6 = bVar21;
        }
        if (uVar1 != 2) {
          bVar8 = bVar9;
        }
        if (uVar1 != 1) {
          bVar6 = bVar7;
        }
        uVar20 = uVar19;
        bVar18 = bVar8;
        bVar7 = bVar6;
        if (iVar15 == 1) {
          uVar20 = local_34;
          bVar18 = bVar22;
          bVar7 = bVar21;
        }
        if (uVar1 != 2) {
          bVar7 = bVar6;
        }
        if (uVar1 != 3) {
          bVar18 = bVar8;
        }
        bVar9 = bVar18;
        bVar8 = bVar7;
        if (iVar15 == 2) {
          bVar9 = bVar22;
          bVar8 = bVar21;
        }
        if (uVar1 != 3) {
          bVar8 = bVar7;
        }
        if (1 < uVar1 - 3) {
          bVar13 = bVar16;
        }
        bVar7 = bVar8;
        if (iVar15 == 3) {
          bVar7 = bVar21;
        }
        if (uVar1 != 4) {
          bVar9 = bVar18;
          uVar20 = uVar19;
          bVar7 = bVar8;
        }
        lVar14 = lVar14 + 1;
        local_68 = opt;
        local_48 = bottom_blob;
        local_40 = top_blob;
        uVar19 = uVar20;
        bVar16 = bVar13;
      } while (lVar11 != lVar14);
    }
  }
  if (top_blob != bottom_blob) {
    piVar3 = bottom_blob->refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    piVar3 = top_blob->refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        if (top_blob->allocator == (Allocator *)0x0) {
          if (top_blob->data != (void *)0x0) {
            local_48 = bottom_blob;
            local_40 = top_blob;
            free(top_blob->data);
            bottom_blob = local_48;
            top_blob = local_40;
          }
        }
        else {
          local_48 = bottom_blob;
          local_40 = top_blob;
          (**(code **)(*(long *)top_blob->allocator + 0x18))();
          bottom_blob = local_48;
          top_blob = local_40;
        }
      }
    }
    top_blob->cstep = 0;
    top_blob->data = (void *)0x0;
    top_blob->refcount = (int *)0x0;
    *(undefined1 (*) [16])((long)&top_blob->refcount + 4) = (undefined1  [16])0x0;
    top_blob->dims = 0;
    top_blob->w = 0;
    top_blob->h = 0;
    top_blob->d = 0;
    top_blob->c = 0;
    piVar3 = bottom_blob->refcount;
    top_blob->data = bottom_blob->data;
    top_blob->refcount = piVar3;
    top_blob->elemsize = bottom_blob->elemsize;
    top_blob->elempack = bottom_blob->elempack;
    top_blob->allocator = bottom_blob->allocator;
    iVar15 = bottom_blob->w;
    iVar4 = bottom_blob->h;
    iVar5 = bottom_blob->d;
    top_blob->dims = bottom_blob->dims;
    top_blob->w = iVar15;
    top_blob->h = iVar4;
    top_blob->d = iVar5;
    top_blob->c = bottom_blob->c;
    top_blob->cstep = bottom_blob->cstep;
  }
  switch(uVar1) {
  case 1:
    if (bVar7 != false) {
      local_68 = opt;
      local_50 = uVar17;
      Mat::reshape(&local_b8,bottom_blob,1,opt->blob_allocator);
      if (&local_b8 != top_blob) {
        if (local_b8.refcount != (int *)0x0) {
          LOCK();
          *local_b8.refcount = *local_b8.refcount + 1;
          UNLOCK();
        }
        piVar3 = top_blob->refcount;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (**(code **)(*(long *)top_blob->allocator + 0x18))();
            }
          }
        }
        top_blob->cstep = 0;
        top_blob->data = (void *)0x0;
        top_blob->refcount = (int *)0x0;
        *(undefined1 (*) [16])((long)&top_blob->refcount + 4) = (undefined1  [16])0x0;
        top_blob->dims = 0;
        top_blob->w = 0;
        top_blob->h = 0;
        top_blob->d = 0;
        top_blob->c = 0;
        top_blob->data = local_b8.data;
        top_blob->refcount = local_b8.refcount;
        top_blob->elemsize = local_b8.elemsize;
        top_blob->elempack = local_b8.elempack;
        top_blob->allocator = local_b8.allocator;
        top_blob->dims = local_b8.dims;
        top_blob->w = local_b8.w;
        top_blob->h = local_b8.h;
        top_blob->d = local_b8.d;
        top_blob->c = local_b8.c;
        top_blob->cstep = local_b8.cstep;
      }
      uVar17 = local_50;
      opt = local_68;
      if (local_b8.refcount != (int *)0x0) {
        LOCK();
        *local_b8.refcount = *local_b8.refcount + -1;
        UNLOCK();
        if (*local_b8.refcount == 0) {
          if (local_b8.allocator == (Allocator *)0x0) {
            if (local_b8.data != (void *)0x0) {
              free(local_b8.data);
              opt = local_68;
            }
          }
          else {
            (**(code **)(*(long *)local_b8.allocator + 0x18))();
            opt = local_68;
          }
        }
      }
    }
    iVar15 = (int)uVar17;
    if (iVar15 != 4) {
      if (iVar15 != 3) {
        if (iVar15 != 2) goto switchD_004218c6_default;
        goto switchD_004218c6_caseD_2;
      }
      goto switchD_004218c6_caseD_3;
    }
    break;
  case 2:
switchD_004218c6_caseD_2:
    if (bVar7 == false) {
      if (bVar9 != false) {
        local_68 = opt;
        local_50 = uVar17;
        Mat::reshape(&local_b8,bottom_blob,local_5c,opt->blob_allocator);
        if (&local_b8 != top_blob) {
          if (local_b8.refcount != (int *)0x0) {
            LOCK();
            *local_b8.refcount = *local_b8.refcount + 1;
            UNLOCK();
          }
          piVar3 = top_blob->refcount;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (**(code **)(*(long *)top_blob->allocator + 0x18))();
              }
            }
          }
          top_blob->cstep = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          *(undefined1 (*) [16])((long)&top_blob->refcount + 4) = (undefined1  [16])0x0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->d = 0;
          top_blob->c = 0;
          top_blob->data = local_b8.data;
          top_blob->refcount = local_b8.refcount;
          top_blob->elemsize = local_b8.elemsize;
          top_blob->elempack = local_b8.elempack;
          top_blob->allocator = local_b8.allocator;
          top_blob->dims = local_b8.dims;
          top_blob->w = local_b8.w;
          top_blob->h = local_b8.h;
          top_blob->d = local_b8.d;
          top_blob->c = local_b8.c;
          top_blob->cstep = local_b8.cstep;
        }
        uVar17 = local_50;
        opt = local_68;
        if (local_b8.refcount != (int *)0x0) {
          LOCK();
          *local_b8.refcount = *local_b8.refcount + -1;
          UNLOCK();
          if (*local_b8.refcount == 0) {
            if (local_b8.allocator == (Allocator *)0x0) goto LAB_00421d92;
            (**(code **)(*(long *)local_b8.allocator + 0x18))();
            opt = local_68;
          }
        }
      }
    }
    else if (bVar9 == false) {
      local_68 = opt;
      Mat::reshape(&local_b8,bottom_blob,local_60,opt->blob_allocator);
      if (&local_b8 != top_blob) {
        if (local_b8.refcount != (int *)0x0) {
          LOCK();
          *local_b8.refcount = *local_b8.refcount + 1;
          UNLOCK();
        }
        piVar3 = top_blob->refcount;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (**(code **)(*(long *)top_blob->allocator + 0x18))();
            }
          }
        }
        top_blob->cstep = 0;
        top_blob->data = (void *)0x0;
        top_blob->refcount = (int *)0x0;
        *(undefined1 (*) [16])((long)&top_blob->refcount + 4) = (undefined1  [16])0x0;
        top_blob->dims = 0;
        top_blob->w = 0;
        top_blob->h = 0;
        top_blob->d = 0;
        top_blob->c = 0;
        top_blob->data = local_b8.data;
        top_blob->refcount = local_b8.refcount;
        top_blob->elemsize = local_b8.elemsize;
        top_blob->elempack = local_b8.elempack;
        top_blob->allocator = local_b8.allocator;
        top_blob->dims = local_b8.dims;
        top_blob->w = local_b8.w;
        top_blob->h = local_b8.h;
        top_blob->d = local_b8.d;
        top_blob->c = local_b8.c;
        top_blob->cstep = local_b8.cstep;
      }
      opt = local_68;
      if (local_b8.refcount != (int *)0x0) {
        LOCK();
        *local_b8.refcount = *local_b8.refcount + -1;
        UNLOCK();
        if (*local_b8.refcount == 0) {
          if (local_b8.allocator == (Allocator *)0x0) goto LAB_00421d92;
          (**(code **)(*(long *)local_b8.allocator + 0x18))();
          opt = local_68;
        }
      }
    }
    else {
      local_68 = opt;
      Mat::reshape(&local_b8,bottom_blob,1,opt->blob_allocator);
      if (&local_b8 != top_blob) {
        if (local_b8.refcount != (int *)0x0) {
          LOCK();
          *local_b8.refcount = *local_b8.refcount + 1;
          UNLOCK();
        }
        piVar3 = top_blob->refcount;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (**(code **)(*(long *)top_blob->allocator + 0x18))();
            }
          }
        }
        top_blob->cstep = 0;
        top_blob->data = (void *)0x0;
        top_blob->refcount = (int *)0x0;
        *(undefined1 (*) [16])((long)&top_blob->refcount + 4) = (undefined1  [16])0x0;
        top_blob->dims = 0;
        top_blob->w = 0;
        top_blob->h = 0;
        top_blob->d = 0;
        top_blob->c = 0;
        top_blob->data = local_b8.data;
        top_blob->refcount = local_b8.refcount;
        top_blob->elemsize = local_b8.elemsize;
        top_blob->elempack = local_b8.elempack;
        top_blob->allocator = local_b8.allocator;
        top_blob->dims = local_b8.dims;
        top_blob->w = local_b8.w;
        top_blob->h = local_b8.h;
        top_blob->d = local_b8.d;
        top_blob->c = local_b8.c;
        top_blob->cstep = local_b8.cstep;
      }
      opt = local_68;
      if (local_b8.refcount != (int *)0x0) {
        LOCK();
        *local_b8.refcount = *local_b8.refcount + -1;
        UNLOCK();
        if (*local_b8.refcount == 0) {
          if (local_b8.allocator == (Allocator *)0x0) {
LAB_00421d92:
            opt = local_68;
            if (local_b8.data != (void *)0x0) {
              free(local_b8.data);
              opt = local_68;
            }
          }
          else {
            (**(code **)(*(long *)local_b8.allocator + 0x18))();
            opt = local_68;
          }
        }
      }
    }
    if ((int)uVar17 != 4) {
      if ((int)uVar17 != 3) goto switchD_004218c6_default;
      goto switchD_004218c6_caseD_3;
    }
    break;
  case 3:
switchD_004218c6_caseD_3:
    local_68 = opt;
    if ((bVar7 & bVar9) == 0) {
      if ((bVar9 & bVar13) == 0) {
LAB_00421f11:
        if (bVar7 == false) {
          if (bVar9 == false) {
            if (bVar13 != false) {
              local_50 = uVar17;
              Mat::reshape(&local_b8,bottom_blob,local_5c,local_60,opt->blob_allocator);
              if (&local_b8 != top_blob) {
                if (local_b8.refcount != (int *)0x0) {
                  LOCK();
                  *local_b8.refcount = *local_b8.refcount + 1;
                  UNLOCK();
                }
                piVar3 = top_blob->refcount;
                if (piVar3 != (int *)0x0) {
                  LOCK();
                  *piVar3 = *piVar3 + -1;
                  UNLOCK();
                  if (*piVar3 == 0) {
                    if (top_blob->allocator == (Allocator *)0x0) {
                      if (top_blob->data != (void *)0x0) {
                        free(top_blob->data);
                      }
                    }
                    else {
                      (**(code **)(*(long *)top_blob->allocator + 0x18))();
                    }
                  }
                }
                top_blob->cstep = 0;
                top_blob->data = (void *)0x0;
                top_blob->refcount = (int *)0x0;
                *(undefined1 (*) [16])((long)&top_blob->refcount + 4) = (undefined1  [16])0x0;
                top_blob->dims = 0;
                top_blob->w = 0;
                top_blob->h = 0;
                top_blob->d = 0;
                top_blob->c = 0;
                top_blob->data = local_b8.data;
                top_blob->refcount = local_b8.refcount;
                top_blob->elemsize = local_b8.elemsize;
                top_blob->elempack = local_b8.elempack;
                top_blob->allocator = local_b8.allocator;
                top_blob->dims = local_b8.dims;
                top_blob->w = local_b8.w;
                top_blob->h = local_b8.h;
                top_blob->d = local_b8.d;
                top_blob->c = local_b8.c;
                top_blob->cstep = local_b8.cstep;
              }
              uVar17 = local_50;
              if (local_b8.refcount != (int *)0x0) {
                LOCK();
                *local_b8.refcount = *local_b8.refcount + -1;
                UNLOCK();
                if (*local_b8.refcount == 0) {
                  if (local_b8.allocator == (Allocator *)0x0) goto LAB_004225e2;
                  (**(code **)(*(long *)local_b8.allocator + 0x18))();
                }
              }
            }
          }
          else {
            local_50 = uVar17;
            Mat::reshape(&local_b8,bottom_blob,local_5c,local_58,opt->blob_allocator);
            if (&local_b8 != top_blob) {
              if (local_b8.refcount != (int *)0x0) {
                LOCK();
                *local_b8.refcount = *local_b8.refcount + 1;
                UNLOCK();
              }
              piVar3 = top_blob->refcount;
              if (piVar3 != (int *)0x0) {
                LOCK();
                *piVar3 = *piVar3 + -1;
                UNLOCK();
                if (*piVar3 == 0) {
                  if (top_blob->allocator == (Allocator *)0x0) {
                    if (top_blob->data != (void *)0x0) {
                      free(top_blob->data);
                    }
                  }
                  else {
                    (**(code **)(*(long *)top_blob->allocator + 0x18))();
                  }
                }
              }
              top_blob->cstep = 0;
              top_blob->data = (void *)0x0;
              top_blob->refcount = (int *)0x0;
              *(undefined1 (*) [16])((long)&top_blob->refcount + 4) = (undefined1  [16])0x0;
              top_blob->dims = 0;
              top_blob->w = 0;
              top_blob->h = 0;
              top_blob->d = 0;
              top_blob->c = 0;
              top_blob->data = local_b8.data;
              top_blob->refcount = local_b8.refcount;
              top_blob->elemsize = local_b8.elemsize;
              top_blob->elempack = local_b8.elempack;
              top_blob->allocator = local_b8.allocator;
              top_blob->dims = local_b8.dims;
              top_blob->w = local_b8.w;
              top_blob->h = local_b8.h;
              top_blob->d = local_b8.d;
              top_blob->c = local_b8.c;
              top_blob->cstep = local_b8.cstep;
            }
            uVar17 = local_50;
            if (local_b8.refcount != (int *)0x0) {
              LOCK();
              *local_b8.refcount = *local_b8.refcount + -1;
              UNLOCK();
              if (*local_b8.refcount == 0) {
                if (local_b8.allocator == (Allocator *)0x0) goto LAB_004225e2;
                (**(code **)(*(long *)local_b8.allocator + 0x18))();
              }
            }
          }
        }
        else if (bVar13 == false) {
          Mat::reshape(&local_b8,bottom_blob,local_60,local_58,opt->blob_allocator);
          if (&local_b8 != top_blob) {
            if (local_b8.refcount != (int *)0x0) {
              LOCK();
              *local_b8.refcount = *local_b8.refcount + 1;
              UNLOCK();
            }
            piVar3 = top_blob->refcount;
            if (piVar3 != (int *)0x0) {
              LOCK();
              *piVar3 = *piVar3 + -1;
              UNLOCK();
              if (*piVar3 == 0) {
                if (top_blob->allocator == (Allocator *)0x0) {
                  if (top_blob->data != (void *)0x0) {
                    free(top_blob->data);
                  }
                }
                else {
                  (**(code **)(*(long *)top_blob->allocator + 0x18))();
                }
              }
            }
            top_blob->cstep = 0;
            top_blob->data = (void *)0x0;
            top_blob->refcount = (int *)0x0;
            *(undefined1 (*) [16])((long)&top_blob->refcount + 4) = (undefined1  [16])0x0;
            top_blob->dims = 0;
            top_blob->w = 0;
            top_blob->h = 0;
            top_blob->d = 0;
            top_blob->c = 0;
            top_blob->data = local_b8.data;
            top_blob->refcount = local_b8.refcount;
            top_blob->elemsize = local_b8.elemsize;
            top_blob->elempack = local_b8.elempack;
            top_blob->allocator = local_b8.allocator;
            top_blob->dims = local_b8.dims;
            top_blob->w = local_b8.w;
            top_blob->h = local_b8.h;
            top_blob->d = local_b8.d;
            top_blob->c = local_b8.c;
            top_blob->cstep = local_b8.cstep;
          }
          if (local_b8.refcount != (int *)0x0) {
            LOCK();
            *local_b8.refcount = *local_b8.refcount + -1;
            UNLOCK();
            if (*local_b8.refcount == 0) {
              if (local_b8.allocator == (Allocator *)0x0) goto LAB_004225e2;
              (**(code **)(*(long *)local_b8.allocator + 0x18))();
            }
          }
        }
        else {
          Mat::reshape(&local_b8,bottom_blob,local_60,opt->blob_allocator);
          if (&local_b8 != top_blob) {
            if (local_b8.refcount != (int *)0x0) {
              LOCK();
              *local_b8.refcount = *local_b8.refcount + 1;
              UNLOCK();
            }
            piVar3 = top_blob->refcount;
            if (piVar3 != (int *)0x0) {
              LOCK();
              *piVar3 = *piVar3 + -1;
              UNLOCK();
              if (*piVar3 == 0) {
                if (top_blob->allocator == (Allocator *)0x0) {
                  if (top_blob->data != (void *)0x0) {
                    free(top_blob->data);
                  }
                }
                else {
                  (**(code **)(*(long *)top_blob->allocator + 0x18))();
                }
              }
            }
            top_blob->cstep = 0;
            top_blob->data = (void *)0x0;
            top_blob->refcount = (int *)0x0;
            *(undefined1 (*) [16])((long)&top_blob->refcount + 4) = (undefined1  [16])0x0;
            top_blob->dims = 0;
            top_blob->w = 0;
            top_blob->h = 0;
            top_blob->d = 0;
            top_blob->c = 0;
            top_blob->data = local_b8.data;
            top_blob->refcount = local_b8.refcount;
            top_blob->elemsize = local_b8.elemsize;
            top_blob->elempack = local_b8.elempack;
            top_blob->allocator = local_b8.allocator;
            top_blob->dims = local_b8.dims;
            top_blob->w = local_b8.w;
            top_blob->h = local_b8.h;
            top_blob->d = local_b8.d;
            top_blob->c = local_b8.c;
            top_blob->cstep = local_b8.cstep;
          }
          if (local_b8.refcount != (int *)0x0) {
            LOCK();
            *local_b8.refcount = *local_b8.refcount + -1;
            UNLOCK();
            if (*local_b8.refcount == 0) {
              if (local_b8.allocator == (Allocator *)0x0) {
LAB_004225e2:
                if (local_b8.data != (void *)0x0) {
                  free(local_b8.data);
                }
              }
              else {
                (**(code **)(*(long *)local_b8.allocator + 0x18))();
              }
            }
          }
        }
      }
      else {
        Mat::reshape(&local_b8,bottom_blob,local_5c,opt->blob_allocator);
        if (&local_b8 != top_blob) {
          if (local_b8.refcount != (int *)0x0) {
            LOCK();
            *local_b8.refcount = *local_b8.refcount + 1;
            UNLOCK();
          }
          piVar3 = top_blob->refcount;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (**(code **)(*(long *)top_blob->allocator + 0x18))();
              }
            }
          }
          top_blob->cstep = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          *(undefined1 (*) [16])((long)&top_blob->refcount + 4) = (undefined1  [16])0x0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->d = 0;
          top_blob->c = 0;
          top_blob->data = local_b8.data;
          top_blob->refcount = local_b8.refcount;
          top_blob->elemsize = local_b8.elemsize;
          top_blob->elempack = local_b8.elempack;
          top_blob->allocator = local_b8.allocator;
          top_blob->dims = local_b8.dims;
          top_blob->w = local_b8.w;
          top_blob->h = local_b8.h;
          top_blob->d = local_b8.d;
          top_blob->c = local_b8.c;
          top_blob->cstep = local_b8.cstep;
        }
        if (local_b8.refcount != (int *)0x0) {
          LOCK();
          *local_b8.refcount = *local_b8.refcount + -1;
          UNLOCK();
          if (*local_b8.refcount == 0) {
            if (local_b8.allocator == (Allocator *)0x0) goto LAB_004225e2;
            (**(code **)(*(long *)local_b8.allocator + 0x18))();
          }
        }
      }
    }
    else if (bVar13 == false) {
      if (bVar9 == false) goto LAB_00421f11;
      Mat::reshape(&local_b8,bottom_blob,local_58,opt->blob_allocator);
      if (&local_b8 != top_blob) {
        if (local_b8.refcount != (int *)0x0) {
          LOCK();
          *local_b8.refcount = *local_b8.refcount + 1;
          UNLOCK();
        }
        piVar3 = top_blob->refcount;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (**(code **)(*(long *)top_blob->allocator + 0x18))();
            }
          }
        }
        top_blob->cstep = 0;
        top_blob->data = (void *)0x0;
        top_blob->refcount = (int *)0x0;
        *(undefined1 (*) [16])((long)&top_blob->refcount + 4) = (undefined1  [16])0x0;
        top_blob->dims = 0;
        top_blob->w = 0;
        top_blob->h = 0;
        top_blob->d = 0;
        top_blob->c = 0;
        top_blob->data = local_b8.data;
        top_blob->refcount = local_b8.refcount;
        top_blob->elemsize = local_b8.elemsize;
        top_blob->elempack = local_b8.elempack;
        top_blob->allocator = local_b8.allocator;
        top_blob->dims = local_b8.dims;
        top_blob->w = local_b8.w;
        top_blob->h = local_b8.h;
        top_blob->d = local_b8.d;
        top_blob->c = local_b8.c;
        top_blob->cstep = local_b8.cstep;
      }
      if (local_b8.refcount != (int *)0x0) {
        LOCK();
        *local_b8.refcount = *local_b8.refcount + -1;
        UNLOCK();
        if (*local_b8.refcount == 0) {
          if (local_b8.allocator == (Allocator *)0x0) goto LAB_004225e2;
          (**(code **)(*(long *)local_b8.allocator + 0x18))();
        }
      }
    }
    else {
      Mat::reshape(&local_b8,bottom_blob,1,opt->blob_allocator);
      if (&local_b8 != top_blob) {
        if (local_b8.refcount != (int *)0x0) {
          LOCK();
          *local_b8.refcount = *local_b8.refcount + 1;
          UNLOCK();
        }
        piVar3 = top_blob->refcount;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (**(code **)(*(long *)top_blob->allocator + 0x18))();
            }
          }
        }
        top_blob->cstep = 0;
        top_blob->data = (void *)0x0;
        top_blob->refcount = (int *)0x0;
        *(undefined1 (*) [16])((long)&top_blob->refcount + 4) = (undefined1  [16])0x0;
        top_blob->dims = 0;
        top_blob->w = 0;
        top_blob->h = 0;
        top_blob->d = 0;
        top_blob->c = 0;
        top_blob->data = local_b8.data;
        top_blob->refcount = local_b8.refcount;
        top_blob->elemsize = local_b8.elemsize;
        top_blob->elempack = local_b8.elempack;
        top_blob->allocator = local_b8.allocator;
        top_blob->dims = local_b8.dims;
        top_blob->w = local_b8.w;
        top_blob->h = local_b8.h;
        top_blob->d = local_b8.d;
        top_blob->c = local_b8.c;
        top_blob->cstep = local_b8.cstep;
      }
      if (local_b8.refcount != (int *)0x0) {
        LOCK();
        *local_b8.refcount = *local_b8.refcount + -1;
        UNLOCK();
        if (*local_b8.refcount == 0) {
          if (local_b8.allocator == (Allocator *)0x0) goto LAB_004225e2;
          (**(code **)(*(long *)local_b8.allocator + 0x18))();
        }
      }
    }
    opt = local_68;
    if ((int)uVar17 != 4) goto switchD_004218c6_default;
    break;
  case 4:
    break;
  default:
    goto switchD_004218c6_default;
  }
  bVar12 = (byte)uVar20;
  if ((bVar7 & bVar9) == 0) {
LAB_004226e2:
    if ((bVar9 & bVar12 & bVar13) == 0) {
      if (bVar7 == false) {
LAB_004229ab:
        if (bVar9 == false) {
LAB_00422a87:
          if ((bVar7 & bVar13) == 0) {
            if ((bVar12 & bVar13) == 0) {
              if (bVar7 == false) {
                if (bVar9 == false) {
                  if (uVar20 == 0) {
                    if (bVar13 == false) goto switchD_004218c6_default;
                    Mat::reshape(&local_b8,bottom_blob,local_5c,local_60,local_54,
                                 opt->blob_allocator);
                    if (&local_b8 != top_blob) {
                      if (local_b8.refcount != (int *)0x0) {
                        LOCK();
                        *local_b8.refcount = *local_b8.refcount + 1;
                        UNLOCK();
                      }
                      piVar3 = top_blob->refcount;
                      if (piVar3 != (int *)0x0) {
                        LOCK();
                        *piVar3 = *piVar3 + -1;
                        UNLOCK();
                        if (*piVar3 == 0) {
                          if (top_blob->allocator == (Allocator *)0x0) {
                            if (top_blob->data != (void *)0x0) {
                              free(top_blob->data);
                            }
                          }
                          else {
                            (**(code **)(*(long *)top_blob->allocator + 0x18))();
                          }
                        }
                      }
                      top_blob->cstep = 0;
                      top_blob->data = (void *)0x0;
                      top_blob->refcount = (int *)0x0;
                      *(undefined1 (*) [16])((long)&top_blob->refcount + 4) = (undefined1  [16])0x0;
                      top_blob->dims = 0;
                      top_blob->w = 0;
                      top_blob->h = 0;
                      top_blob->d = 0;
                      top_blob->c = 0;
                      top_blob->data = local_b8.data;
                      top_blob->refcount = local_b8.refcount;
                      top_blob->elemsize = local_b8.elemsize;
                      top_blob->elempack = local_b8.elempack;
                      top_blob->allocator = local_b8.allocator;
                      top_blob->dims = local_b8.dims;
                      top_blob->w = local_b8.w;
                      top_blob->h = local_b8.h;
                      top_blob->d = local_b8.d;
                      top_blob->c = local_b8.c;
                      top_blob->cstep = local_b8.cstep;
                    }
                    if (local_b8.refcount == (int *)0x0) goto switchD_004218c6_default;
                    LOCK();
                    *local_b8.refcount = *local_b8.refcount + -1;
                    UNLOCK();
                    if (*local_b8.refcount != 0) goto switchD_004218c6_default;
                    if (local_b8.allocator != (Allocator *)0x0) {
                      (**(code **)(*(long *)local_b8.allocator + 0x18))();
                      goto switchD_004218c6_default;
                    }
                  }
                  else {
                    Mat::reshape(&local_b8,bottom_blob,local_5c,local_60,local_58,
                                 opt->blob_allocator);
                    if (&local_b8 != top_blob) {
                      if (local_b8.refcount != (int *)0x0) {
                        LOCK();
                        *local_b8.refcount = *local_b8.refcount + 1;
                        UNLOCK();
                      }
                      piVar3 = top_blob->refcount;
                      if (piVar3 != (int *)0x0) {
                        LOCK();
                        *piVar3 = *piVar3 + -1;
                        UNLOCK();
                        if (*piVar3 == 0) {
                          if (top_blob->allocator == (Allocator *)0x0) {
                            if (top_blob->data != (void *)0x0) {
                              free(top_blob->data);
                            }
                          }
                          else {
                            (**(code **)(*(long *)top_blob->allocator + 0x18))();
                          }
                        }
                      }
                      top_blob->cstep = 0;
                      top_blob->data = (void *)0x0;
                      top_blob->refcount = (int *)0x0;
                      *(undefined1 (*) [16])((long)&top_blob->refcount + 4) = (undefined1  [16])0x0;
                      top_blob->dims = 0;
                      top_blob->w = 0;
                      top_blob->h = 0;
                      top_blob->d = 0;
                      top_blob->c = 0;
                      top_blob->data = local_b8.data;
                      top_blob->refcount = local_b8.refcount;
                      top_blob->elemsize = local_b8.elemsize;
                      top_blob->elempack = local_b8.elempack;
                      top_blob->allocator = local_b8.allocator;
                      top_blob->dims = local_b8.dims;
                      top_blob->w = local_b8.w;
                      top_blob->h = local_b8.h;
                      top_blob->d = local_b8.d;
                      top_blob->c = local_b8.c;
                      top_blob->cstep = local_b8.cstep;
                    }
                    if (local_b8.refcount == (int *)0x0) goto switchD_004218c6_default;
                    LOCK();
                    *local_b8.refcount = *local_b8.refcount + -1;
                    UNLOCK();
                    if (*local_b8.refcount != 0) goto switchD_004218c6_default;
                    if (local_b8.allocator != (Allocator *)0x0) {
                      (**(code **)(*(long *)local_b8.allocator + 0x18))();
                      goto switchD_004218c6_default;
                    }
                  }
                }
                else {
                  Mat::reshape(&local_b8,bottom_blob,local_5c,local_54,local_58,opt->blob_allocator)
                  ;
                  if (&local_b8 != top_blob) {
                    if (local_b8.refcount != (int *)0x0) {
                      LOCK();
                      *local_b8.refcount = *local_b8.refcount + 1;
                      UNLOCK();
                    }
                    piVar3 = top_blob->refcount;
                    if (piVar3 != (int *)0x0) {
                      LOCK();
                      *piVar3 = *piVar3 + -1;
                      UNLOCK();
                      if (*piVar3 == 0) {
                        if (top_blob->allocator == (Allocator *)0x0) {
                          if (top_blob->data != (void *)0x0) {
                            free(top_blob->data);
                          }
                        }
                        else {
                          (**(code **)(*(long *)top_blob->allocator + 0x18))();
                        }
                      }
                    }
                    top_blob->cstep = 0;
                    top_blob->data = (void *)0x0;
                    top_blob->refcount = (int *)0x0;
                    *(undefined1 (*) [16])((long)&top_blob->refcount + 4) = (undefined1  [16])0x0;
                    top_blob->dims = 0;
                    top_blob->w = 0;
                    top_blob->h = 0;
                    top_blob->d = 0;
                    top_blob->c = 0;
                    top_blob->data = local_b8.data;
                    top_blob->refcount = local_b8.refcount;
                    top_blob->elemsize = local_b8.elemsize;
                    top_blob->elempack = local_b8.elempack;
                    top_blob->allocator = local_b8.allocator;
                    top_blob->dims = local_b8.dims;
                    top_blob->w = local_b8.w;
                    top_blob->h = local_b8.h;
                    top_blob->d = local_b8.d;
                    top_blob->c = local_b8.c;
                    top_blob->cstep = local_b8.cstep;
                  }
                  if (local_b8.refcount == (int *)0x0) goto switchD_004218c6_default;
                  LOCK();
                  *local_b8.refcount = *local_b8.refcount + -1;
                  UNLOCK();
                  if (*local_b8.refcount != 0) goto switchD_004218c6_default;
                  if (local_b8.allocator != (Allocator *)0x0) {
                    (**(code **)(*(long *)local_b8.allocator + 0x18))();
                    goto switchD_004218c6_default;
                  }
                }
              }
              else {
                Mat::reshape(&local_b8,bottom_blob,local_60,local_54,local_58,opt->blob_allocator);
                if (&local_b8 != top_blob) {
                  if (local_b8.refcount != (int *)0x0) {
                    LOCK();
                    *local_b8.refcount = *local_b8.refcount + 1;
                    UNLOCK();
                  }
                  piVar3 = top_blob->refcount;
                  if (piVar3 != (int *)0x0) {
                    LOCK();
                    *piVar3 = *piVar3 + -1;
                    UNLOCK();
                    if (*piVar3 == 0) {
                      if (top_blob->allocator == (Allocator *)0x0) {
                        if (top_blob->data != (void *)0x0) {
                          free(top_blob->data);
                        }
                      }
                      else {
                        (**(code **)(*(long *)top_blob->allocator + 0x18))();
                      }
                    }
                  }
                  top_blob->cstep = 0;
                  top_blob->data = (void *)0x0;
                  top_blob->refcount = (int *)0x0;
                  *(undefined1 (*) [16])((long)&top_blob->refcount + 4) = (undefined1  [16])0x0;
                  top_blob->dims = 0;
                  top_blob->w = 0;
                  top_blob->h = 0;
                  top_blob->d = 0;
                  top_blob->c = 0;
                  top_blob->data = local_b8.data;
                  top_blob->refcount = local_b8.refcount;
                  top_blob->elemsize = local_b8.elemsize;
                  top_blob->elempack = local_b8.elempack;
                  top_blob->allocator = local_b8.allocator;
                  top_blob->dims = local_b8.dims;
                  top_blob->w = local_b8.w;
                  top_blob->h = local_b8.h;
                  top_blob->d = local_b8.d;
                  top_blob->c = local_b8.c;
                  top_blob->cstep = local_b8.cstep;
                }
                if (local_b8.refcount == (int *)0x0) goto switchD_004218c6_default;
                LOCK();
                *local_b8.refcount = *local_b8.refcount + -1;
                UNLOCK();
                if (*local_b8.refcount != 0) goto switchD_004218c6_default;
                if (local_b8.allocator != (Allocator *)0x0) {
                  (**(code **)(*(long *)local_b8.allocator + 0x18))();
                  goto switchD_004218c6_default;
                }
              }
            }
            else {
              Mat::reshape(&local_b8,bottom_blob,local_5c,local_60,opt->blob_allocator);
              if (&local_b8 != top_blob) {
                if (local_b8.refcount != (int *)0x0) {
                  LOCK();
                  *local_b8.refcount = *local_b8.refcount + 1;
                  UNLOCK();
                }
                piVar3 = top_blob->refcount;
                if (piVar3 != (int *)0x0) {
                  LOCK();
                  *piVar3 = *piVar3 + -1;
                  UNLOCK();
                  if (*piVar3 == 0) {
                    if (top_blob->allocator == (Allocator *)0x0) {
                      if (top_blob->data != (void *)0x0) {
                        free(top_blob->data);
                      }
                    }
                    else {
                      (**(code **)(*(long *)top_blob->allocator + 0x18))();
                    }
                  }
                }
                top_blob->cstep = 0;
                top_blob->data = (void *)0x0;
                top_blob->refcount = (int *)0x0;
                *(undefined1 (*) [16])((long)&top_blob->refcount + 4) = (undefined1  [16])0x0;
                top_blob->dims = 0;
                top_blob->w = 0;
                top_blob->h = 0;
                top_blob->d = 0;
                top_blob->c = 0;
                top_blob->data = local_b8.data;
                top_blob->refcount = local_b8.refcount;
                top_blob->elemsize = local_b8.elemsize;
                top_blob->elempack = local_b8.elempack;
                top_blob->allocator = local_b8.allocator;
                top_blob->dims = local_b8.dims;
                top_blob->w = local_b8.w;
                top_blob->h = local_b8.h;
                top_blob->d = local_b8.d;
                top_blob->c = local_b8.c;
                top_blob->cstep = local_b8.cstep;
              }
              if (local_b8.refcount == (int *)0x0) goto switchD_004218c6_default;
              LOCK();
              *local_b8.refcount = *local_b8.refcount + -1;
              UNLOCK();
              if (*local_b8.refcount != 0) goto switchD_004218c6_default;
              if (local_b8.allocator != (Allocator *)0x0) {
                (**(code **)(*(long *)local_b8.allocator + 0x18))();
                goto switchD_004218c6_default;
              }
            }
          }
          else {
            Mat::reshape(&local_b8,bottom_blob,local_60,local_54,opt->blob_allocator);
            if (&local_b8 != top_blob) {
              if (local_b8.refcount != (int *)0x0) {
                LOCK();
                *local_b8.refcount = *local_b8.refcount + 1;
                UNLOCK();
              }
              piVar3 = top_blob->refcount;
              if (piVar3 != (int *)0x0) {
                LOCK();
                *piVar3 = *piVar3 + -1;
                UNLOCK();
                if (*piVar3 == 0) {
                  if (top_blob->allocator == (Allocator *)0x0) {
                    if (top_blob->data != (void *)0x0) {
                      free(top_blob->data);
                    }
                  }
                  else {
                    (**(code **)(*(long *)top_blob->allocator + 0x18))();
                  }
                }
              }
              top_blob->cstep = 0;
              top_blob->data = (void *)0x0;
              top_blob->refcount = (int *)0x0;
              *(undefined1 (*) [16])((long)&top_blob->refcount + 4) = (undefined1  [16])0x0;
              top_blob->dims = 0;
              top_blob->w = 0;
              top_blob->h = 0;
              top_blob->d = 0;
              top_blob->c = 0;
              top_blob->data = local_b8.data;
              top_blob->refcount = local_b8.refcount;
              top_blob->elemsize = local_b8.elemsize;
              top_blob->elempack = local_b8.elempack;
              top_blob->allocator = local_b8.allocator;
              top_blob->dims = local_b8.dims;
              top_blob->w = local_b8.w;
              top_blob->h = local_b8.h;
              top_blob->d = local_b8.d;
              top_blob->c = local_b8.c;
              top_blob->cstep = local_b8.cstep;
            }
            if (local_b8.refcount == (int *)0x0) goto switchD_004218c6_default;
            LOCK();
            *local_b8.refcount = *local_b8.refcount + -1;
            UNLOCK();
            if (*local_b8.refcount != 0) goto switchD_004218c6_default;
            if (local_b8.allocator != (Allocator *)0x0) {
              (**(code **)(*(long *)local_b8.allocator + 0x18))();
              goto switchD_004218c6_default;
            }
          }
        }
        else if (uVar20 == 0) {
          if (bVar13 == false) goto LAB_00422a87;
          Mat::reshape(&local_b8,bottom_blob,local_5c,local_54,opt->blob_allocator);
          if (&local_b8 != top_blob) {
            if (local_b8.refcount != (int *)0x0) {
              LOCK();
              *local_b8.refcount = *local_b8.refcount + 1;
              UNLOCK();
            }
            piVar3 = top_blob->refcount;
            if (piVar3 != (int *)0x0) {
              LOCK();
              *piVar3 = *piVar3 + -1;
              UNLOCK();
              if (*piVar3 == 0) {
                if (top_blob->allocator == (Allocator *)0x0) {
                  if (top_blob->data != (void *)0x0) {
                    free(top_blob->data);
                  }
                }
                else {
                  (**(code **)(*(long *)top_blob->allocator + 0x18))();
                }
              }
            }
            top_blob->cstep = 0;
            top_blob->data = (void *)0x0;
            top_blob->refcount = (int *)0x0;
            *(undefined1 (*) [16])((long)&top_blob->refcount + 4) = (undefined1  [16])0x0;
            top_blob->dims = 0;
            top_blob->w = 0;
            top_blob->h = 0;
            top_blob->d = 0;
            top_blob->c = 0;
            top_blob->data = local_b8.data;
            top_blob->refcount = local_b8.refcount;
            top_blob->elemsize = local_b8.elemsize;
            top_blob->elempack = local_b8.elempack;
            top_blob->allocator = local_b8.allocator;
            top_blob->dims = local_b8.dims;
            top_blob->w = local_b8.w;
            top_blob->h = local_b8.h;
            top_blob->d = local_b8.d;
            top_blob->c = local_b8.c;
            top_blob->cstep = local_b8.cstep;
          }
          if (local_b8.refcount == (int *)0x0) goto switchD_004218c6_default;
          LOCK();
          *local_b8.refcount = *local_b8.refcount + -1;
          UNLOCK();
          if (*local_b8.refcount != 0) goto switchD_004218c6_default;
          if (local_b8.allocator != (Allocator *)0x0) {
            (**(code **)(*(long *)local_b8.allocator + 0x18))();
            goto switchD_004218c6_default;
          }
        }
        else {
          Mat::reshape(&local_b8,bottom_blob,local_5c,local_58,opt->blob_allocator);
          if (&local_b8 != top_blob) {
            if (local_b8.refcount != (int *)0x0) {
              LOCK();
              *local_b8.refcount = *local_b8.refcount + 1;
              UNLOCK();
            }
            piVar3 = top_blob->refcount;
            if (piVar3 != (int *)0x0) {
              LOCK();
              *piVar3 = *piVar3 + -1;
              UNLOCK();
              if (*piVar3 == 0) {
                if (top_blob->allocator == (Allocator *)0x0) {
                  if (top_blob->data != (void *)0x0) {
                    free(top_blob->data);
                  }
                }
                else {
                  (**(code **)(*(long *)top_blob->allocator + 0x18))();
                }
              }
            }
            top_blob->cstep = 0;
            top_blob->data = (void *)0x0;
            top_blob->refcount = (int *)0x0;
            *(undefined1 (*) [16])((long)&top_blob->refcount + 4) = (undefined1  [16])0x0;
            top_blob->dims = 0;
            top_blob->w = 0;
            top_blob->h = 0;
            top_blob->d = 0;
            top_blob->c = 0;
            top_blob->data = local_b8.data;
            top_blob->refcount = local_b8.refcount;
            top_blob->elemsize = local_b8.elemsize;
            top_blob->elempack = local_b8.elempack;
            top_blob->allocator = local_b8.allocator;
            top_blob->dims = local_b8.dims;
            top_blob->w = local_b8.w;
            top_blob->h = local_b8.h;
            top_blob->d = local_b8.d;
            top_blob->c = local_b8.c;
            top_blob->cstep = local_b8.cstep;
          }
          if (local_b8.refcount == (int *)0x0) goto switchD_004218c6_default;
          LOCK();
          *local_b8.refcount = *local_b8.refcount + -1;
          UNLOCK();
          if (*local_b8.refcount != 0) goto switchD_004218c6_default;
          if (local_b8.allocator != (Allocator *)0x0) {
            (**(code **)(*(long *)local_b8.allocator + 0x18))();
            goto switchD_004218c6_default;
          }
        }
      }
      else if ((bVar12 & bVar13) == 0) {
        if (bVar9 == false) {
LAB_00422942:
          if (uVar20 == 0) goto LAB_004229ab;
          Mat::reshape(&local_b8,bottom_blob,local_60,local_58,opt->blob_allocator);
          if (&local_b8 != top_blob) {
            if (local_b8.refcount != (int *)0x0) {
              LOCK();
              *local_b8.refcount = *local_b8.refcount + 1;
              UNLOCK();
            }
            piVar3 = top_blob->refcount;
            if (piVar3 != (int *)0x0) {
              LOCK();
              *piVar3 = *piVar3 + -1;
              UNLOCK();
              if (*piVar3 == 0) {
                if (top_blob->allocator == (Allocator *)0x0) {
                  if (top_blob->data != (void *)0x0) {
                    free(top_blob->data);
                  }
                }
                else {
                  (**(code **)(*(long *)top_blob->allocator + 0x18))();
                }
              }
            }
            top_blob->cstep = 0;
            top_blob->data = (void *)0x0;
            top_blob->refcount = (int *)0x0;
            *(undefined1 (*) [16])((long)&top_blob->refcount + 4) = (undefined1  [16])0x0;
            top_blob->dims = 0;
            top_blob->w = 0;
            top_blob->h = 0;
            top_blob->d = 0;
            top_blob->c = 0;
            top_blob->data = local_b8.data;
            top_blob->refcount = local_b8.refcount;
            top_blob->elemsize = local_b8.elemsize;
            top_blob->elempack = local_b8.elempack;
            top_blob->allocator = local_b8.allocator;
            top_blob->dims = local_b8.dims;
            top_blob->w = local_b8.w;
            top_blob->h = local_b8.h;
            top_blob->d = local_b8.d;
            top_blob->c = local_b8.c;
            top_blob->cstep = local_b8.cstep;
          }
          if (local_b8.refcount == (int *)0x0) goto switchD_004218c6_default;
          LOCK();
          *local_b8.refcount = *local_b8.refcount + -1;
          UNLOCK();
          if (*local_b8.refcount != 0) goto switchD_004218c6_default;
          if (local_b8.allocator != (Allocator *)0x0) {
            (**(code **)(*(long *)local_b8.allocator + 0x18))();
            goto switchD_004218c6_default;
          }
        }
        else if (bVar13 == false) {
          if (bVar9 == false) goto LAB_00422942;
          Mat::reshape(&local_b8,bottom_blob,local_54,local_58,opt->blob_allocator);
          if (&local_b8 != top_blob) {
            if (local_b8.refcount != (int *)0x0) {
              LOCK();
              *local_b8.refcount = *local_b8.refcount + 1;
              UNLOCK();
            }
            piVar3 = top_blob->refcount;
            if (piVar3 != (int *)0x0) {
              LOCK();
              *piVar3 = *piVar3 + -1;
              UNLOCK();
              if (*piVar3 == 0) {
                if (top_blob->allocator == (Allocator *)0x0) {
                  if (top_blob->data != (void *)0x0) {
                    free(top_blob->data);
                  }
                }
                else {
                  (**(code **)(*(long *)top_blob->allocator + 0x18))();
                }
              }
            }
            top_blob->cstep = 0;
            top_blob->data = (void *)0x0;
            top_blob->refcount = (int *)0x0;
            *(undefined1 (*) [16])((long)&top_blob->refcount + 4) = (undefined1  [16])0x0;
            top_blob->dims = 0;
            top_blob->w = 0;
            top_blob->h = 0;
            top_blob->d = 0;
            top_blob->c = 0;
            top_blob->data = local_b8.data;
            top_blob->refcount = local_b8.refcount;
            top_blob->elemsize = local_b8.elemsize;
            top_blob->elempack = local_b8.elempack;
            top_blob->allocator = local_b8.allocator;
            top_blob->dims = local_b8.dims;
            top_blob->w = local_b8.w;
            top_blob->h = local_b8.h;
            top_blob->d = local_b8.d;
            top_blob->c = local_b8.c;
            top_blob->cstep = local_b8.cstep;
          }
          if (local_b8.refcount == (int *)0x0) goto switchD_004218c6_default;
          LOCK();
          *local_b8.refcount = *local_b8.refcount + -1;
          UNLOCK();
          if (*local_b8.refcount != 0) goto switchD_004218c6_default;
          if (local_b8.allocator != (Allocator *)0x0) {
            (**(code **)(*(long *)local_b8.allocator + 0x18))();
            goto switchD_004218c6_default;
          }
        }
        else {
          Mat::reshape(&local_b8,bottom_blob,local_54,opt->blob_allocator);
          if (&local_b8 != top_blob) {
            if (local_b8.refcount != (int *)0x0) {
              LOCK();
              *local_b8.refcount = *local_b8.refcount + 1;
              UNLOCK();
            }
            piVar3 = top_blob->refcount;
            if (piVar3 != (int *)0x0) {
              LOCK();
              *piVar3 = *piVar3 + -1;
              UNLOCK();
              if (*piVar3 == 0) {
                if (top_blob->allocator == (Allocator *)0x0) {
                  if (top_blob->data != (void *)0x0) {
                    free(top_blob->data);
                  }
                }
                else {
                  (**(code **)(*(long *)top_blob->allocator + 0x18))();
                }
              }
            }
            top_blob->cstep = 0;
            top_blob->data = (void *)0x0;
            top_blob->refcount = (int *)0x0;
            *(undefined1 (*) [16])((long)&top_blob->refcount + 4) = (undefined1  [16])0x0;
            top_blob->dims = 0;
            top_blob->w = 0;
            top_blob->h = 0;
            top_blob->d = 0;
            top_blob->c = 0;
            top_blob->data = local_b8.data;
            top_blob->refcount = local_b8.refcount;
            top_blob->elemsize = local_b8.elemsize;
            top_blob->elempack = local_b8.elempack;
            top_blob->allocator = local_b8.allocator;
            top_blob->dims = local_b8.dims;
            top_blob->w = local_b8.w;
            top_blob->h = local_b8.h;
            top_blob->d = local_b8.d;
            top_blob->c = local_b8.c;
            top_blob->cstep = local_b8.cstep;
          }
          if (local_b8.refcount == (int *)0x0) goto switchD_004218c6_default;
          LOCK();
          *local_b8.refcount = *local_b8.refcount + -1;
          UNLOCK();
          if (*local_b8.refcount != 0) goto switchD_004218c6_default;
          if (local_b8.allocator != (Allocator *)0x0) {
            (**(code **)(*(long *)local_b8.allocator + 0x18))();
            goto switchD_004218c6_default;
          }
        }
      }
      else {
        Mat::reshape(&local_b8,bottom_blob,local_60,opt->blob_allocator);
        if (&local_b8 != top_blob) {
          if (local_b8.refcount != (int *)0x0) {
            LOCK();
            *local_b8.refcount = *local_b8.refcount + 1;
            UNLOCK();
          }
          piVar3 = top_blob->refcount;
          if (piVar3 != (int *)0x0) {
            LOCK();
            *piVar3 = *piVar3 + -1;
            UNLOCK();
            if (*piVar3 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                if (top_blob->data != (void *)0x0) {
                  free(top_blob->data);
                }
              }
              else {
                (**(code **)(*(long *)top_blob->allocator + 0x18))();
              }
            }
          }
          top_blob->cstep = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          *(undefined1 (*) [16])((long)&top_blob->refcount + 4) = (undefined1  [16])0x0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->d = 0;
          top_blob->c = 0;
          top_blob->data = local_b8.data;
          top_blob->refcount = local_b8.refcount;
          top_blob->elemsize = local_b8.elemsize;
          top_blob->elempack = local_b8.elempack;
          top_blob->allocator = local_b8.allocator;
          top_blob->dims = local_b8.dims;
          top_blob->w = local_b8.w;
          top_blob->h = local_b8.h;
          top_blob->d = local_b8.d;
          top_blob->c = local_b8.c;
          top_blob->cstep = local_b8.cstep;
        }
        if (local_b8.refcount == (int *)0x0) goto switchD_004218c6_default;
        LOCK();
        *local_b8.refcount = *local_b8.refcount + -1;
        UNLOCK();
        if (*local_b8.refcount != 0) goto switchD_004218c6_default;
        if (local_b8.allocator != (Allocator *)0x0) {
          (**(code **)(*(long *)local_b8.allocator + 0x18))();
          goto switchD_004218c6_default;
        }
      }
    }
    else {
      Mat::reshape(&local_b8,bottom_blob,local_5c,opt->blob_allocator);
      if (&local_b8 != top_blob) {
        if (local_b8.refcount != (int *)0x0) {
          LOCK();
          *local_b8.refcount = *local_b8.refcount + 1;
          UNLOCK();
        }
        piVar3 = top_blob->refcount;
        if (piVar3 != (int *)0x0) {
          LOCK();
          *piVar3 = *piVar3 + -1;
          UNLOCK();
          if (*piVar3 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              if (top_blob->data != (void *)0x0) {
                free(top_blob->data);
              }
            }
            else {
              (**(code **)(*(long *)top_blob->allocator + 0x18))();
            }
          }
        }
        top_blob->cstep = 0;
        top_blob->data = (void *)0x0;
        top_blob->refcount = (int *)0x0;
        *(undefined1 (*) [16])((long)&top_blob->refcount + 4) = (undefined1  [16])0x0;
        top_blob->dims = 0;
        top_blob->w = 0;
        top_blob->h = 0;
        top_blob->d = 0;
        top_blob->c = 0;
        top_blob->data = local_b8.data;
        top_blob->refcount = local_b8.refcount;
        top_blob->elemsize = local_b8.elemsize;
        top_blob->elempack = local_b8.elempack;
        top_blob->allocator = local_b8.allocator;
        top_blob->dims = local_b8.dims;
        top_blob->w = local_b8.w;
        top_blob->h = local_b8.h;
        top_blob->d = local_b8.d;
        top_blob->c = local_b8.c;
        top_blob->cstep = local_b8.cstep;
      }
      if (local_b8.refcount == (int *)0x0) goto switchD_004218c6_default;
      LOCK();
      *local_b8.refcount = *local_b8.refcount + -1;
      UNLOCK();
      if (*local_b8.refcount != 0) goto switchD_004218c6_default;
      if (local_b8.allocator != (Allocator *)0x0) {
        (**(code **)(*(long *)local_b8.allocator + 0x18))();
        goto switchD_004218c6_default;
      }
    }
  }
  else if ((bVar12 & bVar13) == 0) {
    if ((bVar9 & bVar12) == 0) goto LAB_004226e2;
    Mat::reshape(&local_b8,bottom_blob,local_58,opt->blob_allocator);
    if (&local_b8 != top_blob) {
      if (local_b8.refcount != (int *)0x0) {
        LOCK();
        *local_b8.refcount = *local_b8.refcount + 1;
        UNLOCK();
      }
      piVar3 = top_blob->refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            if (top_blob->data != (void *)0x0) {
              free(top_blob->data);
            }
          }
          else {
            (**(code **)(*(long *)top_blob->allocator + 0x18))();
          }
        }
      }
      top_blob->cstep = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      *(undefined1 (*) [16])((long)&top_blob->refcount + 4) = (undefined1  [16])0x0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->d = 0;
      top_blob->c = 0;
      top_blob->data = local_b8.data;
      top_blob->refcount = local_b8.refcount;
      top_blob->elemsize = local_b8.elemsize;
      top_blob->elempack = local_b8.elempack;
      top_blob->allocator = local_b8.allocator;
      top_blob->dims = local_b8.dims;
      top_blob->w = local_b8.w;
      top_blob->h = local_b8.h;
      top_blob->d = local_b8.d;
      top_blob->c = local_b8.c;
      top_blob->cstep = local_b8.cstep;
    }
    if (local_b8.refcount == (int *)0x0) goto switchD_004218c6_default;
    LOCK();
    *local_b8.refcount = *local_b8.refcount + -1;
    UNLOCK();
    if (*local_b8.refcount != 0) goto switchD_004218c6_default;
    if (local_b8.allocator != (Allocator *)0x0) {
      (**(code **)(*(long *)local_b8.allocator + 0x18))();
      goto switchD_004218c6_default;
    }
  }
  else {
    Mat::reshape(&local_b8,bottom_blob,1,opt->blob_allocator);
    if (&local_b8 != top_blob) {
      if (local_b8.refcount != (int *)0x0) {
        LOCK();
        *local_b8.refcount = *local_b8.refcount + 1;
        UNLOCK();
      }
      piVar3 = top_blob->refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (top_blob->allocator == (Allocator *)0x0) {
            if (top_blob->data != (void *)0x0) {
              free(top_blob->data);
            }
          }
          else {
            (**(code **)(*(long *)top_blob->allocator + 0x18))();
          }
        }
      }
      top_blob->cstep = 0;
      top_blob->data = (void *)0x0;
      top_blob->refcount = (int *)0x0;
      *(undefined1 (*) [16])((long)&top_blob->refcount + 4) = (undefined1  [16])0x0;
      top_blob->dims = 0;
      top_blob->w = 0;
      top_blob->h = 0;
      top_blob->d = 0;
      top_blob->c = 0;
      top_blob->data = local_b8.data;
      top_blob->refcount = local_b8.refcount;
      top_blob->elemsize = local_b8.elemsize;
      top_blob->elempack = local_b8.elempack;
      top_blob->allocator = local_b8.allocator;
      top_blob->dims = local_b8.dims;
      top_blob->w = local_b8.w;
      top_blob->h = local_b8.h;
      top_blob->d = local_b8.d;
      top_blob->c = local_b8.c;
      top_blob->cstep = local_b8.cstep;
    }
    if (local_b8.refcount == (int *)0x0) goto switchD_004218c6_default;
    LOCK();
    *local_b8.refcount = *local_b8.refcount + -1;
    UNLOCK();
    if (*local_b8.refcount != 0) goto switchD_004218c6_default;
    if (local_b8.allocator != (Allocator *)0x0) {
      (**(code **)(*(long *)local_b8.allocator + 0x18))();
      goto switchD_004218c6_default;
    }
  }
  if (local_b8.data != (void *)0x0) {
    free(local_b8.data);
  }
switchD_004218c6_default:
  if (top_blob->data == (void *)0x0) {
    iVar15 = -100;
  }
  else {
    iVar15 = -100;
    if ((long)top_blob->c * top_blob->cstep != 0) {
      iVar15 = 0;
    }
  }
  return iVar15;
}

Assistant:

int Squeeze::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;

    bool _squeeze_w = false;
    bool _squeeze_h = false;
    bool _squeeze_d = false;
    bool _squeeze_c = false;

    if (axes.empty())
    {
        _squeeze_w = w == 1 && squeeze_w;
        _squeeze_h = h == 1 && squeeze_h;
        _squeeze_d = d == 1 && squeeze_d;
        _squeeze_c = channels == 1 && squeeze_c;
    }
    else
    {
        const int* axes_ptr = axes;
        for (int i = 0; i < axes.w; i++)
        {
            int axis = axes_ptr[i];
            if (axis < 0)
                axis = dims + axis;

            if (dims == 1 && axis == 0)
            {
                _squeeze_w = w == 1;
            }
            if (dims == 2 && axis == 0)
            {
                _squeeze_h = h == 1;
            }
            if (dims == 2 && axis == 1)
            {
                _squeeze_w = w == 1;
            }
            if (dims == 3 && axis == 0)
            {
                _squeeze_c = channels == 1;
            }
            if (dims == 3 && axis == 1)
            {
                _squeeze_h = h == 1;
            }
            if (dims == 3 && axis == 2)
            {
                _squeeze_w = w == 1;
            }
            if (dims == 4 && axis == 0)
            {
                _squeeze_c = channels == 1;
            }
            if (dims == 4 && axis == 1)
            {
                _squeeze_d = d == 1;
            }
            if (dims == 4 && axis == 2)
            {
                _squeeze_h = h == 1;
            }
            if (dims == 4 && axis == 3)
            {
                _squeeze_w = w == 1;
            }
        }
    }

    top_blob = bottom_blob;

    if (dims == 1)
    {
        if (_squeeze_w)
        {
            top_blob = bottom_blob.reshape(1, opt.blob_allocator);
        }
    }

    if (dims == 2)
    {
        if (_squeeze_w && _squeeze_h)
        {
            top_blob = bottom_blob.reshape(1, opt.blob_allocator);
        }
        else if (_squeeze_w)
        {
            top_blob = bottom_blob.reshape(h, opt.blob_allocator);
        }
        else if (_squeeze_h)
        {
            top_blob = bottom_blob.reshape(w, opt.blob_allocator);
        }
    }

    if (dims == 3)
    {
        if (_squeeze_w && _squeeze_h && _squeeze_c)
        {
            top_blob = bottom_blob.reshape(1, opt.blob_allocator);
        }
        else if (_squeeze_w && _squeeze_h)
        {
            top_blob = bottom_blob.reshape(channels, opt.blob_allocator);
        }
        else if (_squeeze_h && _squeeze_c)
        {
            top_blob = bottom_blob.reshape(w, opt.blob_allocator);
        }
        else if (_squeeze_w && _squeeze_c)
        {
            top_blob = bottom_blob.reshape(h, opt.blob_allocator);
        }
        else if (_squeeze_w)
        {
            top_blob = bottom_blob.reshape(h, channels, opt.blob_allocator);
        }
        else if (_squeeze_h)
        {
            top_blob = bottom_blob.reshape(w, channels, opt.blob_allocator);
        }
        else if (_squeeze_c)
        {
            top_blob = bottom_blob.reshape(w, h, opt.blob_allocator);
        }
    }

    if (dims == 4)
    {
        if (_squeeze_w && _squeeze_h && _squeeze_d && _squeeze_c)
        {
            top_blob = bottom_blob.reshape(1, opt.blob_allocator);
        }
        else if (_squeeze_w && _squeeze_h && _squeeze_d)
        {
            top_blob = bottom_blob.reshape(channels, opt.blob_allocator);
        }
        else if (_squeeze_h && _squeeze_d && _squeeze_c)
        {
            top_blob = bottom_blob.reshape(w, opt.blob_allocator);
        }
        else if (_squeeze_w && _squeeze_d && _squeeze_c)
        {
            top_blob = bottom_blob.reshape(h, opt.blob_allocator);
        }
        else if (_squeeze_w && _squeeze_h && _squeeze_c)
        {
            top_blob = bottom_blob.reshape(d, opt.blob_allocator);
        }
        else if (_squeeze_w && _squeeze_h)
        {
            top_blob = bottom_blob.reshape(d, channels, opt.blob_allocator);
        }
        else if (_squeeze_w && _squeeze_d)
        {
            top_blob = bottom_blob.reshape(h, channels, opt.blob_allocator);
        }
        else if (_squeeze_h && _squeeze_d)
        {
            top_blob = bottom_blob.reshape(w, channels, opt.blob_allocator);
        }
        else if (_squeeze_h && _squeeze_c)
        {
            top_blob = bottom_blob.reshape(w, d, opt.blob_allocator);
        }
        else if (_squeeze_w && _squeeze_c)
        {
            top_blob = bottom_blob.reshape(h, d, opt.blob_allocator);
        }
        else if (_squeeze_d && _squeeze_c)
        {
            top_blob = bottom_blob.reshape(w, h, opt.blob_allocator);
        }
        else if (_squeeze_w)
        {
            top_blob = bottom_blob.reshape(h, d, channels, opt.blob_allocator);
        }
        else if (_squeeze_h)
        {
            top_blob = bottom_blob.reshape(w, d, channels, opt.blob_allocator);
        }
        else if (_squeeze_d)
        {
            top_blob = bottom_blob.reshape(w, h, channels, opt.blob_allocator);
        }
        else if (_squeeze_c)
        {
            top_blob = bottom_blob.reshape(w, h, d, opt.blob_allocator);
        }
    }

    if (top_blob.empty())
        return -100;

    return 0;
}